

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O0

void DumpGraph(VmModule *module)

{
  undefined1 local_2298 [8];
  InstructionVMGraphContext instGraphCtx;
  undefined1 local_2258 [8];
  char tempBuf [4096];
  char outputBuf [4096];
  undefined1 local_250 [8];
  OutputContext outputCtx;
  VmModule *module_local;
  
  outputCtx.closeStream = (_func_void_void_ptr *)module;
  OutputContext::OutputContext((OutputContext *)local_250);
  outputCtx.outputBufDef._248_8_ = tempBuf + 0xff8;
  outputCtx.outputBuf._0_4_ = 0x1000;
  outputCtx.tempBufDef._248_8_ = local_2258;
  outputCtx.tempBuf._0_4_ = 0x1000;
  outputCtx._536_8_ = OutputContext::FileOpen("inst_graph.txt");
  outputCtx.openStream = OutputContext::FileWrite;
  InstructionVMGraphContext::InstructionVMGraphContext
            ((InstructionVMGraphContext *)local_2298,(OutputContext *)local_250);
  instGraphCtx.lastStartOffset._2_1_ = 1;
  instGraphCtx.lastEndOffset._3_1_ = 0;
  instGraphCtx.lastStartOffset._1_1_ = 1;
  instGraphCtx.lastEndOffset._1_1_ = 1;
  PrintGraph((InstructionVMGraphContext *)local_2298,(VmModule *)outputCtx.closeStream);
  OutputContext::FileClose((void *)outputCtx._536_8_);
  outputCtx.tempBufSize = 0;
  outputCtx._540_4_ = 0;
  OutputContext::~OutputContext((OutputContext *)local_250);
  return;
}

Assistant:

void DumpGraph(VmModule *module)
{
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("inst_graph.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	InstructionVMGraphContext instGraphCtx(outputCtx);

	instGraphCtx.showUsers = true;
	instGraphCtx.displayAsTree = false;
	instGraphCtx.showFullTypes = true;
	instGraphCtx.showSource = true;

	PrintGraph(instGraphCtx, module);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}